

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O3

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::dominant_intervals
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Persistence_intervals *this,size_t where_to_cut)

{
  pointer *pppVar1;
  double dVar2;
  double dVar3;
  pointer ppVar4;
  iterator __position;
  pointer __last;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  pair<double,_double> *__args;
  pointer ppVar9;
  long lVar10;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  position_length_vector;
  allocator_type local_41;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  local_40;
  
  std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::vector(&local_40,
           (long)(this->intervals).
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->intervals).
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4,&local_41);
  __last = local_40.
           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar9 = local_40.
           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->intervals).
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->intervals).
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4;
  if (lVar7 != 0) {
    lVar8 = 8;
    lVar10 = 0;
    do {
      dVar2 = *(double *)((long)&ppVar4->first + lVar8);
      dVar3 = *(double *)((long)ppVar4 + lVar8 + -8);
      *(long *)((long)local_40.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8) = lVar10;
      *(double *)
       ((long)&(local_40.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first + lVar8) = dVar2 - dVar3;
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 >> 4 != lVar10);
  }
  if (local_40.
      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar5 = (long)local_40.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_40.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_long,double>const&,std::pair<unsigned_long,double>const&)>>
              ((__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                )local_40.
                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                )local_40.
                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(const_std::pair<unsigned_long,_double>_&,_const_std::pair<unsigned_long,_double>_&)>
                 )0x1028b8);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_long,double>const&,std::pair<unsigned_long,double>const&)>>
              ((__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                )ppVar9,(__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                         )__last,
               (_Iter_comp_iter<bool_(*)(const_std::pair<unsigned_long,_double>_&,_const_std::pair<unsigned_long,_double>_&)>
                )0x1028b8);
    ppVar9 = local_40.
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = (long)ppVar9 -
          (long)local_40.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (where_to_cut <= uVar5) {
    uVar5 = where_to_cut;
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::reserve
            (__return_storage_ptr__,uVar5);
  uVar5 = (long)local_40.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_40.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (where_to_cut <= uVar5) {
    uVar5 = where_to_cut;
  }
  if (uVar5 != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      __args = (this->intervals).
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)((long)&(local_40.
                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar7);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        _M_realloc_insert<std::pair<double,double>const&>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   __return_storage_ptr__,__position,__args);
      }
      else {
        dVar2 = __args->second;
        (__position._M_current)->first = __args->first;
        (__position._M_current)->second = dVar2;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      uVar5 = uVar5 + 1;
      uVar6 = (long)local_40.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_40.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (where_to_cut <= uVar6) {
        uVar6 = where_to_cut;
      }
      lVar7 = lVar7 + 0x10;
    } while (uVar5 != uVar6);
  }
  if (local_40.
      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_double> *)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double> > Persistence_intervals::dominant_intervals(size_t where_to_cut) const {
  bool dbg = false;
  std::vector<std::pair<size_t, double> > position_length_vector(this->intervals.size());
  for (size_t i = 0; i != this->intervals.size(); ++i) {
    position_length_vector[i] = std::make_pair(i, this->intervals[i].second - this->intervals[i].first);
  }

  std::sort(position_length_vector.begin(), position_length_vector.end(), compare);

  std::vector<std::pair<double, double> > result;
  result.reserve(std::min(where_to_cut, position_length_vector.size()));

  for (size_t i = 0; i != std::min(where_to_cut, position_length_vector.size()); ++i) {
    result.push_back(this->intervals[position_length_vector[i].first]);
    if (dbg)
      std::clog << "Position : " << position_length_vector[i].first << " length : " << position_length_vector[i].second
                << std::endl;
  }

  return result;
}